

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_ratio_node0(REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_DBL *ratio_node0)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_d8;
  double local_c8;
  double local_c0;
  double local_b0;
  double local_a8;
  double local_98;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL m [6];
  REF_DBL length;
  REF_DBL direction [3];
  REF_DBL *ratio_node0_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_NODE ref_node_local;
  
  if ((((node0 < 0) || (ref_node->max <= node0)) || (ref_node->global[node0] < 0)) ||
     (((node1 < 0 || (ref_node->max <= node1)) || (ref_node->global[node1] < 0)))) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x655,
           "ref_node_ratio_node0",3,"node invalid");
    ref_node_local._4_4_ = 3;
  }
  else {
    dVar2 = ref_node->real[node1 * 0xf] - ref_node->real[node0 * 0xf];
    dVar3 = ref_node->real[node1 * 0xf + 1] - ref_node->real[node0 * 0xf + 1];
    dVar4 = ref_node->real[node1 * 0xf + 2] - ref_node->real[node0 * 0xf + 2];
    local_c8 = sqrt(dVar4 * dVar4 + dVar2 * dVar2 + dVar3 * dVar3);
    if (local_c8 * 1e+20 <= 0.0) {
      local_98 = -(local_c8 * 1e+20);
    }
    else {
      local_98 = local_c8 * 1e+20;
    }
    local_a8 = dVar2;
    if (dVar2 <= 0.0) {
      local_a8 = -dVar2;
    }
    if (local_a8 < local_98) {
      if (local_c8 * 1e+20 <= 0.0) {
        local_b0 = -(local_c8 * 1e+20);
      }
      else {
        local_b0 = local_c8 * 1e+20;
      }
      local_c0 = dVar3;
      if (dVar3 <= 0.0) {
        local_c0 = -dVar3;
      }
      if (local_c0 < local_b0) {
        if (local_c8 * 1e+20 <= 0.0) {
          local_c8 = -(local_c8 * 1e+20);
        }
        else {
          local_c8 = local_c8 * 1e+20;
        }
        local_d8 = dVar4;
        if (dVar4 <= 0.0) {
          local_d8 = -dVar4;
        }
        if (local_d8 < local_c8) {
          uVar1 = ref_node_metric_get(ref_node,node0,(REF_DBL *)&ref_private_macro_code_rss_1);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x668,"ref_node_ratio_node0",(ulong)uVar1,"node0 m");
            return uVar1;
          }
          dVar2 = sqrt(dVar4 * (m[4] * dVar4 + m[1] * dVar2 + m[3] * dVar3) +
                       dVar2 * (m[1] * dVar4 + _ref_private_macro_code_rss_1 * dVar2 + m[0] * dVar3)
                       + dVar3 * (m[3] * dVar4 + m[0] * dVar2 + m[2] * dVar3));
          *ratio_node0 = dVar2;
          return 0;
        }
      }
    }
    *ratio_node0 = 0.0;
    ref_node_local._4_4_ = 0;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_ratio_node0(REF_NODE ref_node, REF_INT node0,
                                        REF_INT node1, REF_DBL *ratio_node0) {
  REF_DBL direction[3], length;
  REF_DBL m[6];

  if (!ref_node_valid(ref_node, node0) || !ref_node_valid(ref_node, node1))
    RSS(REF_INVALID, "node invalid");

  direction[0] =
      (ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0));
  direction[1] =
      (ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0));
  direction[2] =
      (ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0));

  length = ref_math_dot(direction, direction);
  length = sqrt(length);

  if (!ref_math_divisible(direction[0], length) ||
      !ref_math_divisible(direction[1], length) ||
      !ref_math_divisible(direction[2], length)) {
    *ratio_node0 = 0.0;
    return REF_SUCCESS;
  }

  RSS(ref_node_metric_get(ref_node, node0, m), "node0 m");
  *ratio_node0 = ref_matrix_sqrt_vt_m_v(m, direction);

  return REF_SUCCESS;
}